

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall line_hash_32::test_method(line_hash_32 *this)

{
  unit_test_log_t *puVar1;
  const_string local_e8;
  const_string local_d8;
  char *local_c8;
  char *local_c0;
  const_string local_b8;
  const_string local_a8;
  char *local_98;
  char *local_90;
  const_string local_88;
  const_string local_78;
  char *local_68;
  char *local_60;
  unit_test_log_t local_58;
  undefined1 local_50;
  undefined1 *local_48;
  char *local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  local_e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_e8.m_end = "";
  local_d8.m_begin = "";
  local_d8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_e8,0x4d,&local_d8);
  puVar1 = &local_58;
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_c0 = "";
  local_34 = 0;
  local_38 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (puVar1,&local_c8,0x4d,1,2,&local_34,"ah::line_hash< std::uint32_t >( 0 )",&local_38,"0"
            );
  local_b8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b8.m_end = "";
  local_a8.m_begin = "";
  local_a8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_b8,0x4e,&local_a8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_90 = "";
  local_38 = 0x12;
  puVar1 = &local_58;
  local_34 = local_38;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (puVar1,&local_98,0x4e,1,2,&local_34,"ah::line_hash< std::uint32_t >( 0x12 )",&local_38,
             "0x12");
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_88.m_end = "";
  local_78.m_begin = "";
  local_78.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_88,0x4f,&local_78);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_60 = "";
  local_34 = 0x12345678;
  local_38 = 0x12345678;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_58,&local_68,0x4f,1,2,&local_34,"ah::line_hash< std::uint32_t >( 0x12345678 )",
             &local_38,"0x12345678");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( line_hash_32 )
{
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint32_t >( 0 ), 0 );
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint32_t >( 0x12 ), 0x12 );
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint32_t >( 0x12345678 ), 0x12345678 );
}